

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O2

void helix_session_subscribe(helix_session_t session,char *symbol,size_t max_orders)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,symbol,&local_39);
  (**(code **)(*(long *)session + 0x18))(session,local_38,max_orders);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void helix_session_subscribe(helix_session_t session, const char *symbol, size_t max_orders)
{
    unwrap(session)->subscribe(symbol, max_orders);
}